

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRStereoNode::render
          (VRStereoNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  long *plVar1;
  bool bVar2;
  undefined8 uVar3;
  VRStereoNode *in_RSI;
  long in_RDI;
  int h;
  int w;
  int y;
  int x;
  undefined1 in_stack_fffffffffffff84f;
  undefined8 in_stack_fffffffffffff850;
  undefined8 in_stack_fffffffffffff858;
  VRDataIndex *in_stack_fffffffffffff860;
  VRDataIndex *in_stack_fffffffffffff870;
  allocator<char> *in_stack_fffffffffffff880;
  undefined1 *puVar4;
  char *in_stack_fffffffffffff888;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  VRString *in_stack_fffffffffffff8b8;
  undefined1 uVar5;
  string *in_stack_fffffffffffff8c0;
  VRDataIndex *in_stack_fffffffffffff8c8;
  string *key;
  VRDataIndex *in_stack_fffffffffffff8d0;
  VRDataIndex *in_stack_fffffffffffff938;
  undefined8 in_stack_fffffffffffff9f8;
  VREyePosition VVar6;
  VRRenderHandler *in_stack_fffffffffffffa00;
  VRRenderHandler *renderHandler_00;
  VRDataIndex *in_stack_fffffffffffffa08;
  VRDataIndex *renderState_00;
  VRStereoNode *in_stack_fffffffffffffa10;
  allocator<char> local_5d1;
  string local_5d0 [39];
  allocator<char> local_5a9;
  string *in_stack_fffffffffffffa58;
  int *in_stack_fffffffffffffa60;
  string *in_stack_fffffffffffffa68;
  string *in_stack_fffffffffffffa70;
  string *in_stack_fffffffffffffa78;
  VRError *in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffaa7;
  _Base_ptr in_stack_fffffffffffffaa8;
  _Base_ptr in_stack_fffffffffffffab0;
  VRDataIndex *in_stack_fffffffffffffab8;
  char local_521 [33];
  _Rb_tree_color local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f9 [3];
  VRDatum_conflict *local_488;
  allocator<char> local_479;
  string local_478 [39];
  undefined1 local_451 [39];
  undefined1 local_42a;
  undefined4 local_408;
  VRDatum_conflict *local_390;
  allocator<char> local_381;
  string local_380 [39];
  allocator<char> local_359;
  string local_358 [39];
  allocator<char> local_331;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [32];
  VRDatum_conflict *local_2e8;
  allocator<char> local_2d9;
  string local_2d8 [39];
  allocator<char> local_2b1;
  string local_2b0 [32];
  VRDatum_conflict *local_290;
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [32];
  VRDatum_conflict *local_238;
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [32];
  VRDatum_conflict *local_1e0;
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [36];
  VRInt local_184;
  VRInt local_180;
  VRInt local_17c;
  VRInt local_178;
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [32];
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  undefined8 local_d9;
  string local_b8 [39];
  undefined1 local_91 [56];
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [40];
  VRStereoNode *local_10;
  
  VVar6 = (VREyePosition)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
  local_10 = in_RSI;
  VRDataIndex::pushState(in_stack_fffffffffffff860);
  if (*(int *)(in_RDI + 0x78) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    renderState_00 = (VRDataIndex *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    VRDataIndex::addData
              (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x18))(*(long **)(in_RDI + 0x70),0);
    renderOneEye(local_10,renderState_00,in_stack_fffffffffffffa00,VVar6);
  }
  else if (*(int *)(in_RDI + 0x78) == 1) {
    renderHandler_00 = (VRRenderHandler *)&local_d9;
    std::allocator<char>::allocator();
    VVar6 = (VREyePosition)((ulong)local_10 >> 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    VRDataIndex::addData
              (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    std::__cxx11::string::~string((string *)((long)&local_d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x18))(*(long **)(in_RDI + 0x70),2);
    renderOneEye(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,renderHandler_00,VVar6);
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x18))(*(long **)(in_RDI + 0x70),3);
    renderOneEye(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,renderHandler_00,VVar6);
  }
  else if (*(int *)(in_RDI + 0x78) == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    VRDataIndex::addData
              (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
    uVar5 = (undefined1)((ulong)in_stack_fffffffffffff8b8 >> 0x38);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator(&local_171);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    bVar2 = VRDataIndex::exists(in_stack_fffffffffffff8d0,(string *)in_stack_fffffffffffff8c8,
                                in_stack_fffffffffffff8c0,(bool)uVar5);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      local_1e0 = (VRDatum_conflict *)
                  VRDataIndex::getValue
                            (in_stack_fffffffffffffab8,(string *)in_stack_fffffffffffffab0,
                             (string *)in_stack_fffffffffffffaa8,(bool)in_stack_fffffffffffffaa7);
      local_178 = VRDatumConverter::operator_cast_to_int
                            ((VRDatumConverter<MinVR::VRDatum> *)0x1797b1);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator(&local_229);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator(&local_201);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      local_238 = (VRDatum_conflict *)
                  VRDataIndex::getValue
                            (in_stack_fffffffffffffab8,(string *)in_stack_fffffffffffffab0,
                             (string *)in_stack_fffffffffffffaa8,(bool)in_stack_fffffffffffffaa7);
      local_17c = VRDatumConverter::operator_cast_to_int
                            ((VRDatumConverter<MinVR::VRDatum> *)0x1798bb);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator(&local_281);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator(&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      local_290 = (VRDatum_conflict *)
                  VRDataIndex::getValue
                            (in_stack_fffffffffffffab8,(string *)in_stack_fffffffffffffab0,
                             (string *)in_stack_fffffffffffffaa8,(bool)in_stack_fffffffffffffaa7);
      local_180 = VRDatumConverter::operator_cast_to_int
                            ((VRDatumConverter<MinVR::VRDatum> *)0x1799c5);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      local_2e8 = (VRDatum_conflict *)
                  VRDataIndex::getValue
                            (in_stack_fffffffffffffab8,(string *)in_stack_fffffffffffffab0,
                             (string *)in_stack_fffffffffffffaa8,(bool)in_stack_fffffffffffffaa7);
      local_184 = VRDatumConverter::operator_cast_to_int
                            ((VRDatumConverter<MinVR::VRDatum> *)0x179acf);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator(&local_331);
      std::__cxx11::string::~string(local_308);
      std::allocator<char>::~allocator(&local_309);
    }
    else {
      local_178 = 0;
      local_17c = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      bVar2 = VRDataIndex::exists(in_stack_fffffffffffff8d0,(string *)in_stack_fffffffffffff8c8,
                                  in_stack_fffffffffffff8c0,(bool)uVar5);
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator(&local_381);
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator(&local_359);
      if (!bVar2) {
        local_42a = 1;
        uVar3 = __cxa_allocate_exception(0xa8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
        local_408 = 0x44;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
        VRError::VRError(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                         in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                         in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        local_42a = 0;
        __cxa_throw(uVar3,&VRError::typeinfo,VRError::~VRError);
      }
      local_390 = (VRDatum_conflict *)VRDataIndex::getValue(in_stack_fffffffffffff938);
      local_180 = VRDatumConverter::operator_cast_to_int
                            ((VRDatumConverter<MinVR::VRDatum> *)0x179f12);
      key = (string *)local_451;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      uVar5 = (undefined1)((ulong)&local_479 >> 0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
      bVar2 = VRDataIndex::exists(in_stack_fffffffffffff8d0,key,(string *)local_10,(bool)uVar5);
      std::__cxx11::string::~string(local_478);
      std::allocator<char>::~allocator(&local_479);
      std::__cxx11::string::~string((string *)(local_451 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_451);
      if (!bVar2) {
        uVar3 = __cxa_allocate_exception(0xa8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
        this_00 = local_4f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
        local_500 = 0x4a;
        __s = local_521;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this_00,__s,in_stack_fffffffffffff880);
        VRError::VRError(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                         in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                         in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        __cxa_throw(uVar3,&VRError::typeinfo,VRError::~VRError);
      }
      local_488 = (VRDatum_conflict *)VRDataIndex::getValue(in_stack_fffffffffffff938);
      local_184 = VRDatumConverter::operator_cast_to_int
                            ((VRDatumConverter<MinVR::VRDatum> *)0x17a2d4);
    }
    plVar1 = *(long **)(in_RDI + 0x70);
    puVar4 = &stack0xfffffffffffffab8;
    VRRect::VRRect((VRRect *)in_stack_fffffffffffff860,
                   (float)((ulong)in_stack_fffffffffffff858 >> 0x20),
                   (float)in_stack_fffffffffffff858,
                   (float)((ulong)in_stack_fffffffffffff850 >> 0x20),
                   (float)in_stack_fffffffffffff850,(bool)in_stack_fffffffffffff84f);
    (**(code **)(*plVar1 + 0x20))(plVar1,puVar4);
    VRRect::~VRRect((VRRect *)0x17a5f5);
    renderOneEye(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,VVar6
                );
    plVar1 = *(long **)(in_RDI + 0x70);
    in_stack_fffffffffffff870 = (VRDataIndex *)&stack0xfffffffffffffa98;
    VRRect::VRRect((VRRect *)in_stack_fffffffffffff860,
                   (float)((ulong)in_stack_fffffffffffff858 >> 0x20),
                   (float)in_stack_fffffffffffff858,
                   (float)((ulong)in_stack_fffffffffffff850 >> 0x20),
                   (float)in_stack_fffffffffffff850,(bool)in_stack_fffffffffffff84f);
    (**(code **)(*plVar1 + 0x20))(plVar1,in_stack_fffffffffffff870);
    VRRect::~VRRect((VRRect *)0x17a697);
    renderOneEye(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,VVar6
                );
  }
  else if (*(int *)(in_RDI + 0x78) == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    VRDataIndex::addData
              (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffa78);
    std::__cxx11::string::~string(local_5d0);
    std::allocator<char>::~allocator(&local_5d1);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffa58);
    std::allocator<char>::~allocator(&local_5a9);
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x30))();
    renderOneEye(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,VVar6
                );
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x28))();
    renderOneEye(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,VVar6
                );
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x38))();
  }
  VRDataIndex::popState(in_stack_fffffffffffff870);
  return;
}

Assistant:

void VRStereoNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler) {
  renderState->pushState();

	if (_format == VRSTEREOFORMAT_MONO) {
		renderState->addData("StereoFormat", "Mono");

		_gfxToolkit->setDrawBuffer(VRGraphicsToolkit::VRDRAWBUFFER_BACK);
		renderOneEye(renderState, renderHandler, Cyclops);
	}
	else if (_format == VRSTEREOFORMAT_QUADBUFFERED) {
		renderState->addData("StereoFormat", "QuadBuffered");

		_gfxToolkit->setDrawBuffer(VRGraphicsToolkit::VRDRAWBUFFER_BACKLEFT);
		renderOneEye(renderState, renderHandler, Left);

		_gfxToolkit->setDrawBuffer(VRGraphicsToolkit::VRDRAWBUFFER_BACKRIGHT);
		renderOneEye(renderState, renderHandler, Right);
	}
	else if (_format == VRSTEREOFORMAT_SIDEBYSIDE) {
		renderState->addData("StereoFormat", "SideBySide");

		int x,y,w,h;
		if (renderState->exists("ViewportX")) {
      x = renderState->getValue("ViewportX");
      y = renderState->getValue("ViewportY");
			w = renderState->getValue("ViewportWidth");
			h = renderState->getValue("ViewportHeight");
		}
		else {
      x = 0;
      y = 0;
      if (renderState->exists("WindowWidth")) {
        w = renderState->getValue();
      } else {
        VRERRORNOADV("VRStereoNode needs a window width.");
      }

      if (renderState->exists("WindowHeight")) {
        h = renderState->getValue();
      } else {
        VRERRORNOADV("VRStereoNode needs a window height.");
      }
		}

		_gfxToolkit->setSubWindow(VRRect((float)x, (float)y, (float)(w/2), (float)h));
		renderOneEye(renderState, renderHandler, Left);

		_gfxToolkit->setSubWindow(VRRect((float)(x + w / 2 + 1), (float)y, (float)(w / 2), (float)h));
		renderOneEye(renderState, renderHandler, Right);
	}
	else if (_format == VRSTEREOFORMAT_COLUMNINTERLACED) {
		renderState->addData("StereoFormat", "ColumnInterlaced");

		_gfxToolkit->disableDrawingOnEvenColumns();
		renderOneEye(renderState, renderHandler, Left);

		_gfxToolkit->disableDrawingOnOddColumns();
		renderOneEye(renderState, renderHandler, Right);

		_gfxToolkit->enableDrawingOnAllColumns();
	}

	renderState->popState();
}